

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.h
# Opt level: O0

OutPoint * __thiscall cfd::core::OutPoint::operator=(OutPoint *this,OutPoint *param_2)

{
  Txid *in_RSI;
  OutPoint *in_RDI;
  
  cfd::core::Txid::operator=(&in_RDI->txid_,in_RSI);
  in_RDI->vout_ = *(uint32_t *)&in_RSI[1]._vptr_Txid;
  return in_RDI;
}

Assistant:

class CFD_CORE_EXPORT OutPoint {
 public:
  /**
   * @brief constructor (for vector)
   */
  OutPoint();
  /**
   * @brief constructor.
   * @param[in] txid            txid
   * @param[in] vout            vout
   */
  explicit OutPoint(const Txid& txid, uint32_t vout);

  /**
   * @brief get txid.
   * @return Txid
   */
  const Txid GetTxid() const;
  /**
   * @brief get vout.
   * @return vout
   */
  uint32_t GetVout() const;

  /**
   * @brief check valid object.
   * @retval true
   * @retval false
   */
  bool IsValid() const;

  /**
   * @brief Equals operator.
   * @param[in] object     compare target.
   * @retval true   equals
   * @retval false  not equals
   */
  bool operator==(const OutPoint& object) const;
  /**
   * @brief Not Equals operator.
   * @param[in] object     compare target.
   * @retval true   not equals
   * @retval false  equals
   */
  bool operator!=(const OutPoint& object) const;
  /**
   * @brief Compare object.
   * @param[in] object     compare target.
   * @return compare value (0 is match)
   */
  int Compare(const OutPoint& object) const;

 private:
  Txid txid_;      //!< txid
  uint32_t vout_;  //!< vout
}